

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

BinaryOp __thiscall
wasm::Random::pick<wasm::BinaryOp>(Random *this,FeatureOptions<wasm::BinaryOp> *picker)

{
  BinaryOp BVar1;
  value_type *pvVar2;
  vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_> local_30;
  FeatureOptions<wasm::BinaryOp> *local_18;
  FeatureOptions<wasm::BinaryOp> *picker_local;
  Random *this_local;
  
  local_18 = picker;
  picker_local = (FeatureOptions<wasm::BinaryOp> *)this;
  items<wasm::BinaryOp>(&local_30,this,picker);
  pvVar2 = pick<std::vector<wasm::BinaryOp,std::allocator<wasm::BinaryOp>>>(this,&local_30);
  BVar1 = *pvVar2;
  std::vector<wasm::BinaryOp,_std::allocator<wasm::BinaryOp>_>::~vector(&local_30);
  return BVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }